

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
::alloc<>(allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
          *this)

{
  size_t sVar1;
  holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this_00;
  
  if ((this->mOffset == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *)operator_new(0x58)
    ;
  }
  else {
    sVar1 = this->mOffset;
    this->mOffset = sVar1 - 1;
    this_00 = this->mPool[sVar1 - 1];
  }
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_00->super_baseHolder)._vptr_baseHolder = (_func_int **)0x0;
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this_00->mDat).super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>::holder(this_00);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}